

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::request_prevote(raft_server *this)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  uint uVar3;
  bool bVar4;
  __int_type_conflict _Var5;
  __int_type_conflict _Var6;
  int iVar7;
  uint64_t uVar8;
  element_type *this_00;
  element_type *peVar9;
  __pthread_internal_list *p_Var10;
  uint *puVar11;
  duration dVar12;
  element_type *peVar13;
  element_type *peVar14;
  ulong uVar15;
  undefined4 extraout_var;
  element_type *peVar16;
  undefined4 extraout_var_00;
  unsigned_long *args_6;
  undefined8 uVar17;
  uint uVar18;
  long in_RDI;
  ptr<req_msg> req;
  ptr<peer> pp_1;
  peer_itor it_1;
  ptr<raft_params> clone;
  int num_voting_members;
  int quorum_size;
  int32 last_active_time_ms;
  bool recreate;
  ptr<srv_config> s_config;
  ptr<peer> pp;
  peer_itor it;
  ptr<cluster_config> c_config;
  ptr<raft_params> params;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_5;
  raft_params *in_stack_fffffffffffffb28;
  undefined4 uVar19;
  peer *in_stack_fffffffffffffb30;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  context *in_stack_fffffffffffffb40;
  raft_server *in_stack_fffffffffffffb48;
  uint in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb54;
  raft_server *in_stack_fffffffffffffb58;
  undefined8 in_stack_fffffffffffffb60;
  cluster_config *in_stack_fffffffffffffb68;
  srv_role _role;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  raft_server *in_stack_fffffffffffffbf0;
  element_type *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  type in_stack_fffffffffffffcd8;
  ptr<req_msg> *in_stack_fffffffffffffce0;
  uint in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  peer *in_stack_fffffffffffffcf0;
  string local_2c0 [48];
  undefined1 local_290 [16];
  element_type *local_280;
  int32 local_278;
  undefined4 local_274;
  element_type *local_270;
  undefined1 local_258 [72];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [48];
  string local_1a0 [36];
  atomic<int> local_17c;
  string local_178 [40];
  string local_150 [32];
  string local_130 [32];
  uint local_110;
  byte local_109;
  __shared_ptr local_108 [40];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_e0 [2];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_d0 [13];
  __node_base local_68;
  uint local_5c;
  float local_58;
  int local_54;
  __native_type local_50;
  memory_order local_28;
  int local_24;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  _Any_data local_10;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x20f9cb);
  nuraft::context::get_params((context *)in_stack_fffffffffffffb48);
  get_config(in_stack_fffffffffffffb48);
  local_e0[1]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffb28);
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_fffffffffffffb30,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             in_stack_fffffffffffffb28);
  while( true ) {
    local_e0[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffb28);
    bVar4 = std::__detail::operator!=(local_d0,local_e0);
    if (!bVar4) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x20fa6a);
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffb30,
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffb28);
    bVar4 = is_regular_member((raft_server *)
                              CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                              (ptr<peer> *)in_stack_fffffffffffffb30);
    if (bVar4) {
      std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20fb00);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x20fb15);
      peer::get_id((peer *)0x20fb1d);
      cluster_config::get_server
                (in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20));
      bVar4 = std::__shared_ptr::operator_cast_to_bool(local_108);
      if (bVar4) {
        local_109 = 0;
        bVar4 = std::atomic::operator_cast_to_bool
                          ((atomic<bool> *)
                           CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        if (bVar4) {
          local_109 = 1;
        }
        else {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x20fb96);
          local_109 = peer::need_to_reconnect
                                ((peer *)CONCAT44(in_stack_fffffffffffffb3c,
                                                  in_stack_fffffffffffffb38));
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x20fbc4);
          uVar8 = peer::get_active_timer_us((peer *)0x20fbcc);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar8;
          uVar18 = SUB164(auVar1 / ZEXT816(1000),0);
          local_110 = uVar18;
          peVar13 = std::
                    __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x20fc0a);
          iVar7 = peVar13->heart_beat_interval_;
          _Var5 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          if (iVar7 * _Var5 < (int)uVar18) {
            bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
            if (bVar4) {
              peVar14 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x20fc70);
              iVar7 = (*peVar14->_vptr_logger[7])();
              if (2 < iVar7) {
                in_stack_fffffffffffffcf0 =
                     (peer *)std::
                             __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x20fca9);
                std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x20fcbe);
                uVar18 = peer::get_id((peer *)0x20fcc6);
                msg_if_given_abi_cxx11_
                          ((char *)local_130,
                           "connection to peer %d is not active long time: %d ms, need reconnection for prevote"
                           ,(ulong)uVar18,(ulong)local_110);
                (**(code **)((long)&(((in_stack_fffffffffffffcf0->config_).
                                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->aux_).field_2 + 8))
                          (in_stack_fffffffffffffcf0,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                           ,"request_prevote",0x49,local_130);
                std::__cxx11::string::~string(local_130);
              }
            }
            local_109 = 1;
          }
        }
        if ((local_109 & 1) != 0) {
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar4) {
            peVar14 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x20fdc0);
            in_stack_fffffffffffffcec = (*peVar14->_vptr_logger[7])();
            if (3 < in_stack_fffffffffffffcec) {
              in_stack_fffffffffffffce0 =
                   (ptr<req_msg> *)
                   std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x20fdf9);
              this_00 = std::
                        __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x20fe0e);
              in_stack_fffffffffffffce8 = srv_config::get_id(this_00);
              msg_if_given_abi_cxx11_
                        ((char *)local_150,"reset RPC client for peer %d",
                         (ulong)in_stack_fffffffffffffce8);
              (*(code *)(((in_stack_fffffffffffffce0->
                          super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                        log_entries_).
                        super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)
                        (in_stack_fffffffffffffce0,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                         ,"request_prevote",0x4f,local_150);
              std::__cxx11::string::~string(local_150);
            }
          }
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x20feb4);
          in_stack_fffffffffffffcd8 =
               std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator*
                         ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                          in_stack_fffffffffffffb30);
          peer::recreate_rpc((peer *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             (ptr<srv_config> *)
                             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                             (context *)
                             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        }
      }
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x20ff0a);
      local_108[0x14] = (__shared_ptr)0x0;
      local_108[0x15] = (__shared_ptr)0x0;
      local_108[0x16] = (__shared_ptr)0x0;
      local_108[0x17] = (__shared_ptr)0x0;
    }
    else {
      local_108[0x14] = (__shared_ptr)0x4;
      local_108[0x15] = (__shared_ptr)0x0;
      local_108[0x16] = (__shared_ptr)0x0;
      local_108[0x17] = (__shared_ptr)0x0;
    }
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x20ff22);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffffb30);
  }
  local_178._36_4_ = get_quorum_for_election(in_stack_fffffffffffffb58);
  _role = (srv_role)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  _Var5 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  _Var6 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  if (0 < _Var5 + _Var6) {
    _Var5 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    _Var6 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (_Var5 + _Var6 < local_178._36_4_ + 1) {
      std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0xe4),0);
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x210072);
        iVar7 = (*peVar14->_vptr_logger[7])();
        if (2 < iVar7) {
          peVar14 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2100ab);
          uVar19 = (undefined4)((ulong)in_stack_fffffffffffffb28 >> 0x20);
          uVar20 = (undefined4)((ulong)in_stack_fffffffffffffb30 >> 0x20);
          peVar9 = (element_type *)(in_RDI + 0xd4);
          local_24 = 5;
          local_20 = peVar9;
          local_28 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_24 - 1U < 2) {
            local_50._36_4_ = *(undefined4 *)&(peVar9->super_msg_base)._vptr_msg_base;
          }
          else if (local_24 == 5) {
            local_50._36_4_ = *(undefined4 *)&(peVar9->super_msg_base)._vptr_msg_base;
          }
          else {
            local_50._36_4_ = *(undefined4 *)&(peVar9->super_msg_base)._vptr_msg_base;
          }
          uVar2 = local_50._36_4_;
          p_Var10 = (__pthread_internal_list *)(in_RDI + 0xd8);
          local_50._20_4_ = 5;
          local_50.__data.__list.__prev = p_Var10;
          local_50.__data.__kind = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_50._20_4_ - 1 < 2) {
            local_50.__data.__nusers = *(undefined4 *)&p_Var10->__prev;
          }
          else if (local_50._20_4_ == 5) {
            local_50.__data.__nusers = *(undefined4 *)&p_Var10->__prev;
          }
          else {
            local_50.__data.__nusers = *(undefined4 *)&p_Var10->__prev;
          }
          uVar18 = uVar2 + local_50.__data.__nusers;
          uVar17 = *(undefined8 *)(in_RDI + 200);
          puVar11 = (uint *)(in_RDI + 0xd4);
          local_54 = 5;
          local_50.__align = (long)puVar11;
          local_58 = (float)std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_54 - 1U < 2) {
            local_5c = *puVar11;
          }
          else if (local_54 == 5) {
            local_5c = *puVar11;
          }
          else {
            local_5c = *puVar11;
          }
          uVar3 = local_5c;
          dVar12.__r = in_RDI + 0xd8;
          local_d0[0xc]._M_cur._4_4_ = 5;
          local_68._M_nxt = (_Hash_node_base *)dVar12.__r;
          local_d0[0xc]._M_cur._0_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_d0[0xc]._M_cur._4_4_ - 1 < 2) {
            local_d0[0xb]._M_cur._4_4_ = *(undefined4 *)dVar12.__r;
          }
          else if (local_d0[0xc]._M_cur._4_4_ == 5) {
            local_d0[0xb]._M_cur._4_4_ = *(undefined4 *)dVar12.__r;
          }
          else {
            local_d0[0xb]._M_cur._4_4_ = *(undefined4 *)dVar12.__r;
          }
          uVar2 = local_d0[0xb]._M_cur._4_4_;
          iVar7 = local_178._36_4_ + 1;
          puVar11 = (uint *)(in_RDI + 0xe4);
          local_d0[9]._M_cur._4_4_ = 5;
          local_d0[10]._M_cur = (__node_type *)puVar11;
          local_d0[9]._M_cur._0_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
          if (local_d0[9]._M_cur._4_4_ - 1 < 2) {
            local_d0[8]._M_cur._4_4_ = *puVar11;
          }
          else if (local_d0[9]._M_cur._4_4_ == 5) {
            local_d0[8]._M_cur._4_4_ = *puVar11;
          }
          else {
            local_d0[8]._M_cur._4_4_ = *puVar11;
          }
          in_stack_fffffffffffffb30 = (peer *)CONCAT44(uVar20,local_d0[8]._M_cur._4_4_);
          in_stack_fffffffffffffb28 = (raft_params *)CONCAT44(uVar19,iVar7);
          msg_if_given_abi_cxx11_
                    ((char *)local_178,
                     "total %d nodes (including this node) responded for pre-vote (term %lu, live %d, dead %d), at least %d nodes should respond. failure count %d"
                     ,(ulong)uVar18,uVar17,(ulong)uVar3,(ulong)(uint)uVar2);
          (*peVar14->_vptr_logger[8])
                    (peVar14,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"request_prevote",0x62,local_178);
          std::__cxx11::string::~string(local_178);
        }
      }
    }
    else {
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                 ,(__int_type_conflict)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    }
  }
  local_17c.super___atomic_base<int>._M_i =
       (__atomic_base<int>)
       get_num_voting_members
                 ((raft_server *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  peVar13 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x21056d);
  if (((peVar13->auto_adjust_quorum_for_small_cluster_ & 1U) != 0) &&
     (local_17c.super___atomic_base<int>._M_i == 2)) {
    _Var5 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    _Var6 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (_Var6 < _Var5) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2105f6);
        in_stack_fffffffffffffc4c = (*peVar14->_vptr_logger[7])();
        if (2 < in_stack_fffffffffffffc4c) {
          in_stack_fffffffffffffc40 =
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x21062f);
          msg_if_given_abi_cxx11_
                    ((char *)local_1a0,
                     "2-node cluster\'s pre-vote is failing long time, adjust quorum to 1");
          (*in_stack_fffffffffffffc40->_vptr_logger[8])
                    (in_stack_fffffffffffffc40,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"request_prevote",0x6d,local_1a0);
          std::__cxx11::string::~string(local_1a0);
        }
      }
      std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffb30);
      cs_new<nuraft::raft_params,nuraft::raft_params&>(in_stack_fffffffffffffb28);
      peVar13 = std::
                __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2106ec);
      peVar13->custom_commit_quorum_size_ = 1;
      peVar13 = std::
                __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x210700);
      peVar13->custom_election_quorum_size_ = 1;
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x21071b);
      nuraft::context::set_params
                (in_stack_fffffffffffffb40,
                 (ptr<raft_params> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x21073a)
      ;
    }
  }
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffb30,
             SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
  std::__atomic_base<int>::operator=
            ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             (__int_type_conflict)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  std::atomic<nuraft::srv_role>::operator=
            ((atomic<nuraft::srv_role> *)in_stack_fffffffffffffb30,
             (srv_role)((ulong)in_stack_fffffffffffffb28 >> 0x20));
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2107cc);
  srv_state::get_term((srv_state *)0x2107d4);
  pre_vote_status_t::reset
            ((pre_vote_status_t *)in_stack_fffffffffffffb30,(ulong)in_stack_fffffffffffffb28);
  std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0xd8),0);
  if (*(int *)(in_RDI + 0x3c) < *(int *)(in_RDI + 0x40)) {
    bVar4 = check_cond_for_zp_election(in_stack_fffffffffffffb58);
    if (!bVar4) {
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar4) {
        peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x210972);
        iVar7 = (*peVar14->_vptr_logger[7])();
        if (3 < iVar7) {
          peVar14 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2109ab);
          msg_if_given_abi_cxx11_
                    ((char *)local_1f0,
                     "[PRIORITY] will not initiate pre-vote due to priority: target %d, mine %d",
                     (ulong)*(uint *)(in_RDI + 0x40),(ulong)*(uint *)(in_RDI + 0x3c));
          (*peVar14->_vptr_logger[8])
                    (peVar14,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"request_prevote",0x80,local_1f0);
          std::__cxx11::string::~string(local_1f0);
        }
      }
      restart_election_timer(in_stack_fffffffffffffbf0);
      local_108[0x14] = (__shared_ptr)0x1;
      local_108[0x15] = (__shared_ptr)0x0;
      local_108[0x16] = (__shared_ptr)0x0;
      local_108[0x17] = (__shared_ptr)0x0;
      goto LAB_0021120f;
    }
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar4) {
      peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x21087a);
      iVar7 = (*peVar14->_vptr_logger[7])();
      if (3 < iVar7) {
        peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2108b3);
        msg_if_given_abi_cxx11_
                  ((char *)local_1d0,
                   "[PRIORITY] temporarily allow election for zero-priority member");
        (*peVar14->_vptr_logger[8])
                  (peVar14,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"request_prevote",0x7d,local_1d0);
        std::__cxx11::string::~string(local_1d0);
      }
    }
  }
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar4) {
    peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x210a97);
    iVar7 = (*peVar14->_vptr_logger[7])();
    if (3 < iVar7) {
      peVar14 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x210ad0);
      uVar19 = (undefined4)((ulong)in_stack_fffffffffffffb30 >> 0x20);
      uVar18 = *(uint *)(in_RDI + 0x38);
      std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x210af6);
      srv_role_to_string_abi_cxx11_(_role);
      uVar17 = std::__cxx11::string::c_str();
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x210b30);
      uVar15 = srv_state::get_term((srv_state *)0x210b38);
      peVar16 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x210b56);
      iVar7 = (*peVar16->_vptr_log_store[2])();
      peVar16 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x210b93);
      (*peVar16->_vptr_log_store[2])();
      in_stack_fffffffffffffb28 =
           (raft_params *)
           term_for_log((raft_server *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)
                        ,(ulong)in_stack_fffffffffffffc40);
      in_stack_fffffffffffffb38 = *(undefined4 *)(in_RDI + 0x3c);
      in_stack_fffffffffffffb30 = (peer *)CONCAT44(uVar19,*(undefined4 *)(in_RDI + 0x40));
      msg_if_given_abi_cxx11_
                ((char *)local_210,
                 "[PRE-VOTE INIT] my id %d, my role %s, term %lu, log idx %lu, log term %lu, priority (target %d / mine %d)\n"
                 ,(ulong)uVar18,uVar17,uVar15,CONCAT44(extraout_var,iVar7) + -1);
      (*peVar14->_vptr_logger[8])
                (peVar14,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"request_prevote",0x8b,local_210);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string((string *)(local_258 + 0x28));
    }
  }
  local_258._24_8_ =
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffb28);
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
              *)in_stack_fffffffffffffb30,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *)
             in_stack_fffffffffffffb28);
  while( true ) {
    local_258._16_8_ =
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                *)in_stack_fffffffffffffb28);
    bVar4 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        *)(local_258 + 0x20),
                       (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        *)(local_258 + 0x10));
    if (!bVar4) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)0x210d37);
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffb30,
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffb28);
    bVar4 = is_regular_member((raft_server *)
                              CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                              (ptr<peer> *)in_stack_fffffffffffffb30);
    if (bVar4) {
      std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x210dbb);
      local_270 = (element_type *)srv_state::get_term((srv_state *)0x210dc3);
      local_274 = 0x14;
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x210e06);
      local_278 = peer::get_id((peer *)0x210e0e);
      peVar16 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x210e39);
      (*peVar16->_vptr_log_store[2])();
      local_280 = (element_type *)
                  term_for_log((raft_server *)
                               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                               (ulong)in_stack_fffffffffffffc40);
      peVar16 = std::
                __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x210e89);
      iVar7 = (*peVar16->_vptr_log_store[2])();
      local_290._8_8_ = CONCAT44(extraout_var_00,iVar7) + -1;
      args_6 = (unsigned_long *)(in_RDI + 0xa0);
      local_10._4_4_ = 5;
      local_10._8_8_ = args_6;
      local_10._0_4_ = std::operator&(memory_order_seq_cst,__memory_order_mask);
      if (local_10._4_4_ - 1 < 2) {
        local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*args_6;
      }
      else if (local_10._4_4_ == 5) {
        local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*args_6;
      }
      else {
        local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*args_6;
      }
      local_290._0_8_ = local_18._M_pi;
      in_stack_fffffffffffffb30 = (peer *)local_290;
      in_stack_fffffffffffffb28 = (raft_params *)(local_290 + 8);
      cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long>
                ((unsigned_long *)in_stack_fffffffffffffb58,
                 (msg_type *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                 (int *)in_stack_fffffffffffffb48,(int *)in_stack_fffffffffffffb40,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 args_6);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x210fb0);
      in_stack_fffffffffffffb77 = peer::make_busy(in_stack_fffffffffffffb30);
      if ((bool)in_stack_fffffffffffffb77) {
        in_stack_fffffffffffffb58 = (raft_server *)local_258;
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x210fdd);
        std::shared_ptr<nuraft::peer>::shared_ptr
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffb30,
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffb28);
        peer::send_req(in_stack_fffffffffffffcf0,
                       (ptr<peer> *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       in_stack_fffffffffffffce0,(rpc_handler *)in_stack_fffffffffffffcd8);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x21102e);
      }
      else {
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar4) {
          peVar14 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2110a3);
          in_stack_fffffffffffffb54 = (*peVar14->_vptr_logger[7])();
          if (2 < in_stack_fffffffffffffb54) {
            in_stack_fffffffffffffb48 =
                 (raft_server *)
                 std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2110d6);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2110e8);
            in_stack_fffffffffffffb50 = peer::get_id((peer *)0x2110f0);
            std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x211103);
            in_stack_fffffffffffffb40 = (context *)peer::get_endpoint_abi_cxx11_((peer *)0x21110b);
            uVar17 = std::__cxx11::string::c_str();
            msg_if_given_abi_cxx11_
                      ((char *)local_2c0,"failed to send prevote request: peer %d (%s) is busy",
                       (ulong)in_stack_fffffffffffffb50,uVar17);
            (*in_stack_fffffffffffffb48->_vptr_raft_server[8])
                      (in_stack_fffffffffffffb48,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"request_prevote",0xa0,local_2c0);
            std::__cxx11::string::~string(local_2c0);
          }
        }
      }
      std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x2111ad);
      local_108[0x14] = (__shared_ptr)0x0;
      local_108[0x15] = (__shared_ptr)0x0;
      local_108[0x16] = (__shared_ptr)0x0;
      local_108[0x17] = (__shared_ptr)0x0;
    }
    else {
      local_108[0x14] = (__shared_ptr)0x7;
      local_108[0x15] = (__shared_ptr)0x0;
      local_108[0x16] = (__shared_ptr)0x0;
      local_108[0x17] = (__shared_ptr)0x0;
    }
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2111c5);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_stack_fffffffffffffb30);
  }
  local_108[0x14] = (__shared_ptr)0x0;
  local_108[0x15] = (__shared_ptr)0x0;
  local_108[0x16] = (__shared_ptr)0x0;
  local_108[0x17] = (__shared_ptr)0x0;
LAB_0021120f:
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x21121c);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x211229);
  return;
}

Assistant:

void raft_server::request_prevote() {
    ptr<raft_params> params = ctx_->get_params();
    ptr<cluster_config> c_config = get_config();
    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) continue;
        ptr<srv_config> s_config = c_config->get_server( pp->get_id() );

        if (s_config) {
            bool recreate = false;
            if (hb_alive_) {
                // First pre-vote request: reset RPC client for all peers.
                recreate = true;

            } else {
                // Since second time: reset only if `rpc_` is null.
                recreate = pp->need_to_reconnect();

                // Or if it is not active long time, reconnect as well.
                int32 last_active_time_ms = pp->get_active_timer_us() / 1000;
                if ( last_active_time_ms >
                         params->heart_beat_interval_ *
                             raft_server::raft_limits_.reconnect_limit_ ) {
                    p_wn( "connection to peer %d is not active long time: %d ms, "
                          "need reconnection for prevote",
                          pp->get_id(),
                          last_active_time_ms );
                    recreate = true;
                }
            }

            if (recreate) {
                p_in("reset RPC client for peer %d", s_config->get_id());
                pp->recreate_rpc(s_config, *ctx_);
            }
        }
    }

    int quorum_size = get_quorum_for_election();
    if (pre_vote_.live_ + pre_vote_.dead_ > 0) {
        if (pre_vote_.live_ + pre_vote_.dead_ < quorum_size + 1) {
            // Pre-vote failed due to non-responding voters.
            pre_vote_.failure_count_++;
            p_wn("total %d nodes (including this node) responded for pre-vote "
                 "(term %" PRIu64 ", live %d, dead %d), at least %d nodes should "
                 "respond. failure count %d",
                 pre_vote_.live_.load() + pre_vote_.dead_.load(),
                 pre_vote_.term_,
                 pre_vote_.live_.load(),
                 pre_vote_.dead_.load(),
                 quorum_size + 1,
                 pre_vote_.failure_count_.load());
        } else {
            pre_vote_.failure_count_ = 0;
        }
    }
    int num_voting_members = get_num_voting_members();
    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         num_voting_members == 2 &&
         pre_vote_.failure_count_ > raft_server::raft_limits_.vote_limit_ ) {
        // 2-node cluster's pre-vote failed due to offline node.
        p_wn("2-node cluster's pre-vote is failing long time, "
             "adjust quorum to 1");
        ptr<raft_params> clone = cs_new<raft_params>(*params);
        clone->custom_commit_quorum_size_ = 1;
        clone->custom_election_quorum_size_ = 1;
        ctx_->set_params(clone);
    }

    hb_alive_ = false;
    leader_ = -1;
    role_ = srv_role::candidate;
    pre_vote_.reset(state_->get_term());
    // Count for myself.
    pre_vote_.dead_++;

    if ( my_priority_ < target_priority_ ) {
        if ( check_cond_for_zp_election() ) {
            p_in("[PRIORITY] temporarily allow election for zero-priority member");
        } else {
            p_in("[PRIORITY] will not initiate pre-vote due to priority: "
                 "target %d, mine %d", target_priority_, my_priority_);
            restart_election_timer();
            return;
        }
    }

    p_in("[PRE-VOTE INIT] my id %d, my role %s, term %" PRIu64 ", log idx %" PRIu64 ", "
         "log term %" PRIu64 ", priority (target %d / mine %d)\n",
         id_, srv_role_to_string(role_).c_str(),
         state_->get_term(), log_store_->next_slot() - 1,
         term_for_log(log_store_->next_slot() - 1),
         target_priority_, my_priority_);

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        ptr<peer> pp = it->second;
        if (!is_regular_member(pp)) {
            // Do not send voting request to learner.
            continue;
        }

        ptr<req_msg> req( cs_new<req_msg>
                          ( state_->get_term(),
                            msg_type::pre_vote_request,
                            id_,
                            pp->get_id(),
                            term_for_log(log_store_->next_slot() - 1),
                            log_store_->next_slot() - 1,
                            quick_commit_index_.load() ) );
        if (pp->make_busy()) {
            pp->send_req(pp, req, resp_handler_);
        } else {
            p_wn("failed to send prevote request: peer %d (%s) is busy",
                 pp->get_id(), pp->get_endpoint().c_str());
        }
    }
}